

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  ExprList *pEVar1;
  Offset OVar2;
  pointer pLVar3;
  Result RVar4;
  size_t sVar5;
  Expr *pEVar6;
  char *__function;
  Expr **ppEVar7;
  bool bVar8;
  LabelNode *local_40;
  LabelNode *label;
  Expr *expr;
  
  RVar4 = TopLabelExpr(this,&local_40,(Expr **)&label);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_40->label_type) {
  case Block:
    if (*(int *)&label[2].exprs != 7) {
      __function = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_00f45e83;
    }
    break;
  case Loop:
    if (*(int *)&label[2].exprs != 0x16) {
      __function = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_00f45e83;
    }
    break;
  case If:
    if (*(int *)&label[2].exprs != 0x13) {
LAB_00f45d4f:
      __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_00f45e83:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                    ,0x4e,__function);
    }
    break;
  case Else:
    if (*(int *)&label[2].exprs != 0x13) goto LAB_00f45d4f;
    goto LAB_00f45d9f;
  case IfExcept:
    if (*(int *)&label[2].exprs != 0x14) {
LAB_00f45e57:
      __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExceptExpr, Base = wabt::Expr]";
      goto LAB_00f45e83;
    }
    break;
  case IfExceptElse:
    if (*(int *)&label[2].exprs != 0x14) goto LAB_00f45e57;
LAB_00f45d9f:
    pEVar6 = (Expr *)this->filename_;
    pEVar1 = (ExprList *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    sVar5 = strlen((char *)pEVar6);
    label[0xc].context = pEVar6;
    *(size_t *)(label + 0xd) = sVar5;
    label[0xd].exprs = pEVar1;
    ppEVar7 = &label[0xd].context;
    goto LAB_00f45e17;
  case Try:
    if (*(int *)&label[2].exprs != 0x2e) {
      __function = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
      goto LAB_00f45e83;
    }
    break;
  default:
    goto switchD_00f45cf0_default;
  }
  pEVar1 = (ExprList *)this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pEVar6 = (Expr *)strlen((char *)pEVar1);
  label[10].exprs = pEVar1;
  label[10].context = pEVar6;
  *(Offset *)(label + 0xb) = OVar2;
  ppEVar7 = (Expr **)&label[0xb].exprs;
LAB_00f45e17:
  *ppEVar7 = (Expr *)0x0;
switchD_00f45cf0_default:
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pLVar3 == (this->label_stack_).
                    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if (bVar8) {
    PrintError(this,"popping empty label stack");
  }
  else {
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar3 + -1;
  }
  return (Result)(uint)bVar8;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));
  switch (label->label_type) {
    case LabelType::Block:
      cast<BlockExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::Loop:
      cast<LoopExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::If:
      cast<IfExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::Else:
      cast<IfExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::IfExcept:
      cast<IfExceptExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::IfExceptElse:
      cast<IfExceptExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::Try:
      cast<TryExpr>(expr)->block.end_loc = GetLocation();
      break;

    case LabelType::Func:
    case LabelType::Catch:
      break;
  }

  return PopLabel();
}